

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_split.cpp
# Opt level: O3

bool __thiscall BamTools::SplitTool::SplitToolPrivate::SplitReference(SplitToolPrivate *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_color _Var2;
  int32_t iVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  long *plVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  ostream *poVar11;
  size_type *psVar12;
  long *plVar13;
  _Base_ptr p_Var14;
  ulong uVar15;
  string refName;
  string refPrefix;
  string outputFilename;
  map<int,_BamTools::BamWriter_*,_std::less<int>,_std::allocator<std::pair<const_int,_BamTools::BamWriter_*>_>_>
  outputFiles;
  BamAlignment al;
  undefined1 *local_280;
  undefined8 local_278;
  undefined1 local_270 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  SplitToolPrivate *local_240;
  long *local_238;
  _Base_ptr local_230;
  long local_228;
  long lStack_220;
  string local_218;
  string *local_1f8;
  RefVector *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  BamReader *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  _Rb_tree<int,_std::pair<const_int,_BamTools::BamWriter_*>,_std::_Select1st<std::pair<const_int,_BamTools::BamWriter_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BamTools::BamWriter_*>_>_>
  local_1b8;
  BamAlignment local_188;
  
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1b8._M_impl.super__Rb_tree_header._M_header;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260,SPLIT_REFERENCE_TOKEN_abi_cxx11_,
             DAT_001f32c8 + SPLIT_REFERENCE_TOKEN_abi_cxx11_);
  if (this->m_settings->HasCustomRefPrefix == true) {
    std::__cxx11::string::_M_assign((string *)&local_260);
  }
  lVar7 = std::__cxx11::string::find((char)&local_260,0x2e);
  if (lVar7 != 0) {
    local_280 = local_270;
    std::__cxx11::string::_M_construct((ulong)&local_280,'\x01');
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_280,(ulong)local_260._M_dataplus._M_p);
    paVar1 = &local_188.Name.field_2;
    psVar12 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_188.Name.field_2._M_allocated_capacity = *psVar12;
      local_188.Name.field_2._8_8_ = plVar8[3];
      local_188.Name._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_188.Name.field_2._M_allocated_capacity = *psVar12;
      local_188.Name._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_188.Name._M_string_length = plVar8[1];
    *plVar8 = (long)psVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_260,(string *)&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.Name._M_dataplus._M_p != paVar1) {
      operator_delete(local_188.Name._M_dataplus._M_p);
    }
    if (local_280 != local_270) {
      operator_delete(local_280);
    }
  }
  BamAlignment::BamAlignment(&local_188);
  local_1e0 = &this->m_reader;
  local_1f0 = &this->m_references;
  local_1e8 = &this->m_outputFilenameStub;
  local_1f8 = &this->m_header;
  local_240 = this;
  do {
    bVar5 = BamReader::GetNextAlignment(local_1e0,&local_188);
    iVar3 = local_188.RefID;
    if (!bVar5) {
      CloseWriters<int>(local_240,
                        (map<int,_BamTools::BamWriter_*,_std::less<int>,_std::allocator<std::pair<const_int,_BamTools::BamWriter_*>_>_>
                         *)&local_1b8);
LAB_001752d5:
      BamAlignment::~BamAlignment(&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_BamTools::BamWriter_*>,_std::_Select1st<std::pair<const_int,_BamTools::BamWriter_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BamTools::BamWriter_*>_>_>
      ::~_Rb_tree(&local_1b8);
      return !bVar5;
    }
    if (local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_00175034:
      local_280 = local_270;
      local_278 = 0;
      local_270[0] = 0;
      if (local_188.RefID == -1) {
        std::__cxx11::string::_M_replace((ulong)&local_280,0,(char *)0x0,0x1c3de4);
      }
      else {
        uVar15 = ((long)(local_240->m_references).
                        super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_240->m_references).
                        super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
        if (uVar15 < (ulong)(long)local_188.RefID || uVar15 - (long)local_188.RefID == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        std::__cxx11::string::_M_assign((string *)&local_280);
      }
      std::operator+(&local_1d8,local_1e8,&local_260);
      plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_280);
      plVar13 = plVar8 + 2;
      if ((long *)*plVar8 == plVar13) {
        local_228 = *plVar13;
        lStack_220 = plVar8[3];
        local_238 = &local_228;
      }
      else {
        local_228 = *plVar13;
        local_238 = (long *)*plVar8;
      }
      local_230 = (_Base_ptr)plVar8[1];
      *plVar8 = (long)plVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_238);
      psVar12 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_218.field_2._M_allocated_capacity = *psVar12;
        local_218.field_2._8_8_ = plVar8[3];
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      }
      else {
        local_218.field_2._M_allocated_capacity = *psVar12;
        local_218._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_218._M_string_length = plVar8[1];
      *plVar8 = (long)psVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_238 != &local_228) {
        operator_delete(local_238);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      p_Var10 = (_Base_ptr)operator_new(8);
      BamWriter::BamWriter((BamWriter *)p_Var10);
      bVar6 = BamWriter::Open((BamWriter *)p_Var10,&local_218,local_1f8,local_1f0);
      if (bVar6) {
        local_238 = (long *)CONCAT44(local_238._4_4_,iVar3);
        local_230 = p_Var10;
        std::
        _Rb_tree<int,std::pair<int_const,BamTools::BamWriter*>,std::_Select1st<std::pair<int_const,BamTools::BamWriter*>>,std::less<int>,std::allocator<std::pair<int_const,BamTools::BamWriter*>>>
        ::_M_emplace_unique<std::pair<int,BamTools::BamWriter*>>
                  ((_Rb_tree<int,std::pair<int_const,BamTools::BamWriter*>,std::_Select1st<std::pair<int_const,BamTools::BamWriter*>>,std::less<int>,std::allocator<std::pair<int_const,BamTools::BamWriter*>>>
                    *)&local_1b8,(pair<int,_BamTools::BamWriter_*> *)&local_238);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"bamtools split ERROR: could not open ",0x25);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,local_218._M_dataplus._M_p,
                             local_218._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," for writing.",0xd);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p);
      }
      if (local_280 != local_270) {
        operator_delete(local_280);
      }
      if (bVar6) goto LAB_001752a5;
      goto LAB_001752d5;
    }
    p_Var10 = &local_1b8._M_impl.super__Rb_tree_header._M_header;
    p_Var4 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      p_Var14 = p_Var4;
      p_Var9 = p_Var10;
      _Var2 = p_Var14[1]._M_color;
      p_Var10 = p_Var14;
      if ((int)_Var2 < local_188.RefID) {
        p_Var10 = p_Var9;
      }
      p_Var4 = (&p_Var14->_M_left)[(int)_Var2 < local_188.RefID];
    } while ((&p_Var14->_M_left)[(int)_Var2 < local_188.RefID] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var10 == &local_1b8._M_impl.super__Rb_tree_header) goto LAB_00175034;
    if ((int)_Var2 < local_188.RefID) {
      p_Var14 = p_Var9;
    }
    if (local_188.RefID < (int)p_Var14[1]._M_color) goto LAB_00175034;
    p_Var10 = p_Var10[1]._M_parent;
    if (p_Var10 != (_Base_ptr)0x0) {
LAB_001752a5:
      BamWriter::SaveAlignment((BamWriter *)p_Var10,&local_188);
    }
  } while( true );
}

Assistant:

bool SplitTool::SplitToolPrivate::SplitReference()
{

    // set up splitting data structure
    std::map<int32_t, BamWriter*> outputFiles;
    std::map<int32_t, BamWriter*>::iterator writerIter;

    // determine reference prefix
    std::string refPrefix = SPLIT_REFERENCE_TOKEN;
    if (m_settings->HasCustomRefPrefix) refPrefix = m_settings->CustomRefPrefix;

    // make sure prefix starts with '.'
    const std::size_t dotFound = refPrefix.find('.');
    if (dotFound != 0) refPrefix = std::string(1, '.') + refPrefix;

    // iterate through alignments
    BamAlignment al;
    BamWriter* writer;
    int32_t currentRefId;
    while (m_reader.GetNextAlignment(al)) {

        // see if bool value exists
        currentRefId = al.RefID;
        writerIter = outputFiles.find(currentRefId);

        // if no writer associated with this value
        if (writerIter == outputFiles.end()) {

            // fetch reference name for ID
            std::string refName;
            if (currentRefId == -1)
                refName = "unmapped";
            else
                refName = m_references.at(currentRefId).RefName;

            // construct new output filename
            const std::string outputFilename = m_outputFilenameStub + refPrefix + refName + ".bam";

            // open new BamWriter
            writer = new BamWriter;
            if (!writer->Open(outputFilename, m_header, m_references)) {
                std::cerr << "bamtools split ERROR: could not open " << outputFilename
                          << " for writing." << std::endl;
                return false;
            }

            // store in map
            outputFiles.insert(std::make_pair(currentRefId, writer));
        }

        // else grab corresponding writer
        else
            writer = (*writerIter).second;

        // store alignment in proper BAM output file
        if (writer) writer->SaveAlignment(al);
    }

    // clean up BamWriters
    CloseWriters(outputFiles);

    // return success
    return true;
}